

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcode.h
# Opt level: O2

void JitFFI::OpCode_x64::_movs_ds_base<(unsigned_char)243>
               (JitFuncCreater *jfc,Register dst,Register src)

{
  byte bVar1;
  
  if ((dst & ~r15) == prax) {
    if ((src & ~r15) == xmm0) {
      JitFuncCreater::push(jfc,0xf3);
      bVar1 = (byte)src >> 1 & 4 | (byte)(dst >> 3) & 1;
      if (bVar1 != 0) {
        JitFuncCreater::push(jfc,bVar1 | 0x40);
      }
      JitFuncCreater::push(jfc,'\x0f','\x11');
      mov_prx_rx_base(jfc,dst,src);
      return;
    }
  }
  else if (((dst & ~r15) == xmm0) && ((src & ~r15) == prax)) {
    JitFuncCreater::push(jfc,0xf3);
    bVar1 = (byte)(dst >> 1) & 4 | (byte)src >> 3 & 1;
    if (bVar1 != 0) {
      JitFuncCreater::push(jfc,bVar1 | 0x40);
    }
    JitFuncCreater::push(jfc,'\x0f','\x10');
    mov_rx_prx_base(jfc,dst,src);
    return;
  }
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/CVM-Projects[P]JitFFI/include/opcode.h"
                ,0x1be,
                "void JitFFI::OpCode_x64::_movs_ds_base(JitFuncCreater &, Register, Register) [_Code = (unsigned char)\'\\xf3\']"
               );
}

Assistant:

inline void _movs_ds_base(JitFuncCreater &jfc, Register dst, Register src) {
			// movs_ XMM, m__
			if (is_xmmx(dst) && is_prx(src)) {
				jfc.push(_Code);
				if (_get_mov_head(src, dst) != 0)
					jfc.push(_get_mov_head_rpxd(src, dst));
				jfc.push(0x0f, 0x10);
				mov_rx_prx_base(jfc, dst, src);
			}
			// movs_ m__, XMM
			else if (is_prx(dst) && is_xmmx(src)) {
				jfc.push(_Code);
				if (_get_mov_head(dst, src) != 0)
					jfc.push(_get_mov_head_rpxd(dst, src));
				jfc.push(0x0f, 0x11);
				mov_prx_rx_base(jfc, dst, src);
			}
			else
				assert(false);
		}